

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void pugi::impl::anon_unknown_0::node_output_attributes
               (xml_buffered_writer *writer,xml_node_struct *node,char_t *indent,
               size_t indent_length,uint flags,uint depth)

{
  byte bVar1;
  xml_attribute_struct *pxVar2;
  size_t __n;
  char_t *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  char_t *extraout_RDX_01;
  char *data;
  xml_attribute_struct **ppxVar3;
  
  bVar1 = ((flags >> 9 & 1) != 0) * '\x05' + 0x22;
  ppxVar3 = &node->first_attribute;
  __n = indent_length;
  __buf = indent;
  while (pxVar2 = *ppxVar3, pxVar2 != (xml_attribute_struct *)0x0) {
    if ((flags & 0x44) == 0x40) {
      xml_buffered_writer::write(writer,10,__buf,__n);
      __n = (size_t)(depth + 1);
      text_output_indent(writer,indent,indent_length,depth + 1);
    }
    else {
      xml_buffered_writer::write(writer,0x20,__buf,__n);
    }
    data = (char *)pxVar2->name;
    if ((char_t *)data == (char_t *)0x0) {
      data = ":anonymous";
    }
    xml_buffered_writer::write_string(writer,(char_t *)data);
    xml_buffered_writer::write(writer,0x3d,(void *)(ulong)bVar1,__n);
    __buf_00 = extraout_RDX;
    if (pxVar2->value != (char_t *)0x0) {
      __n = (size_t)flags;
      text_output(writer,pxVar2->value,ctx_special_attr,flags);
      __buf_00 = extraout_RDX_00;
    }
    xml_buffered_writer::write(writer,(uint)bVar1,__buf_00,__n);
    __buf = extraout_RDX_01;
    ppxVar3 = &pxVar2->next_attribute;
  }
  return;
}

Assistant:

PUGI__FN void node_output_attributes(xml_buffered_writer& writer, xml_node_struct* node, const char_t* indent, size_t indent_length, unsigned int flags, unsigned int depth)
	{
		const char_t* default_name = PUGIXML_TEXT(":anonymous");
		const char_t enquotation_char = (flags & format_attribute_single_quote) ? '\'' : '"';

		for (xml_attribute_struct* a = node->first_attribute; a; a = a->next_attribute)
		{
			if ((flags & (format_indent_attributes | format_raw)) == format_indent_attributes)
			{
				writer.write('\n');

				text_output_indent(writer, indent, indent_length, depth + 1);
			}
			else
			{
				writer.write(' ');
			}

			writer.write_string(a->name ? a->name + 0 : default_name);
			writer.write('=', enquotation_char);

			if (a->value)
				text_output(writer, a->value, ctx_special_attr, flags);

			writer.write(enquotation_char);
		}
	}